

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_conn_ev_data_detach(connectdata *conn,Curl_easy *data)

{
  Curl_cft_cntrl *pCVar1;
  long lVar2;
  Curl_cfilter *pCVar3;
  bool bVar4;
  
  lVar2 = 0;
  do {
    for (pCVar3 = conn->cfilter[lVar2]; pCVar3 != (Curl_cfilter *)0x0; pCVar3 = pCVar3->next) {
      pCVar1 = pCVar3->cft->cntrl;
      if (pCVar1 != Curl_cf_def_cntrl) {
        (*pCVar1)(pCVar3,data,2,0,(void *)0x0);
      }
    }
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  return;
}

Assistant:

void Curl_conn_ev_data_detach(struct connectdata *conn,
                              struct Curl_easy *data)
{
  cf_cntrl_all(conn, data, TRUE, CF_CTRL_DATA_DETACH, 0, NULL);
}